

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmTarget *target,ImportPropertyMap *properties,
          set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
          *emitted)

{
  _Rb_tree_node_base *__k;
  pointer *pppcVar1;
  char *pcVar2;
  iterator __position;
  _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
  *this_00;
  cmExportTryCompileFileGenerator *this_01;
  char *__s;
  mapped_type *pmVar3;
  long lVar4;
  _Base_ptr p_Var5;
  pointer name;
  pair<std::_Rb_tree_iterator<const_cmTarget_*>,_bool> pVar6;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string evalResult;
  cmPropertyMap props;
  cmTarget *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
  *local_a0;
  cmExportTryCompileFileGenerator *local_98;
  ImportPropertyMap *local_90;
  vector<cmTarget_const*,std::allocator<cmTarget_const*>> *local_88;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  local_60;
  
  local_a0 = (_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
              *)emitted;
  local_90 = properties;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              *)target);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_88 = (vector<cmTarget_const*,std::allocator<cmTarget_const*>> *)&this->Exports;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_98 = this;
    do {
      __s = cmProperty::GetValue((cmProperty *)(p_Var5 + 2));
      __k = p_Var5 + 1;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_90,(key_type *)__k);
      pcVar2 = (char *)pmVar3->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar2,(ulong)__s);
      lVar4 = std::__cxx11::string::find((char *)__k,0x59a478,0);
      this_01 = local_98;
      if (lVar4 == 0) {
LAB_0042de51:
        this_00 = local_a0;
        FindTargets(&local_80,this_01,(string *)__k,target,
                    (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                     *)local_a0);
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&local_80,&local_b8,false);
        for (name = local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            name != local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
          local_c0 = cmMakefile::FindTargetToUse(target->Makefile,name,false);
          if (local_c0 != (cmTarget *)0x0) {
            pVar6 = std::
                    _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                    ::_M_insert_unique<cmTarget_const*const&>(this_00,&local_c0);
            if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __position._M_current =
                   (this_01->Exports).
                   super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_01->Exports).
                  super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmTarget_const*,std::allocator<cmTarget_const*>>::
                _M_realloc_insert<cmTarget_const*const&>(local_88,__position,&local_c0);
              }
              else {
                *__position._M_current = local_c0;
                pppcVar1 = &(this_01->Exports).
                            super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)__k,0x59aeca,0);
        if (lVar4 == 0) goto LAB_0042de51;
        lVar4 = std::__cxx11::string::find((char *)__k,0x59a138,0);
        if (lVar4 == 0) goto LAB_0042de51;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
cmExportTryCompileFileGenerator::PopulateProperties(cmTarget const* target,
                                                ImportPropertyMap& properties,
                                          std::set<cmTarget const*> &emitted)
{
  cmPropertyMap props = target->GetProperties();
  for(cmPropertyMap::const_iterator i = props.begin(); i != props.end(); ++i)
    {
    properties[i->first] = i->second.GetValue();

    if(i->first.find("IMPORTED_LINK_INTERFACE_LIBRARIES") == 0
        || i->first.find("IMPORTED_LINK_DEPENDENT_LIBRARIES") == 0
        || i->first.find("INTERFACE_LINK_LIBRARIES") == 0)
      {
      std::string evalResult = this->FindTargets(i->first,
                                                 target, emitted);

      std::vector<std::string> depends;
      cmSystemTools::ExpandListArgument(evalResult, depends);
      for(std::vector<std::string>::const_iterator li = depends.begin();
          li != depends.end(); ++li)
        {
        cmTarget *tgt = target->GetMakefile()->FindTargetToUse(*li);
        if(tgt && emitted.insert(tgt).second)
          {
          this->Exports.push_back(tgt);
          }
        }
      }
    }
}